

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeGeneratorFunctionConstructor
               (DynamicObject *generatorFunctionConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  undefined8 in_RAX;
  uint uVar3;
  StaticType *type;
  LiteralString *pLVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,generatorFunctionConstructor,mode,3,0);
  pJVar1 = (((generatorFunctionConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).
           ptr;
  uVar4 = (ulong)uVar3 << 0x20;
  (*(generatorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorFunctionConstructor,0xd1,&DAT_1000000000001,2,0,0,uVar4);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(generatorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorFunctionConstructor,0x124,
             (pJVar1->super_JavascriptLibraryBase).generatorFunctionPrototype.ptr,0,0,0,uVar4);
  type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
  pLVar2 = LiteralString::New(type,L"GeneratorFunction",0x11,pJVar1->recycler);
  (*(generatorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (generatorFunctionConstructor,0x106,pLVar2,2,0,0,uVar4 & 0xffffffff00000000);
  DynamicObject::SetHasNoEnumerableProperties(generatorFunctionConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeGeneratorFunctionConstructor(DynamicObject* generatorFunctionConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(generatorFunctionConstructor, mode, 3);
        JavascriptLibrary* library = generatorFunctionConstructor->GetLibrary();

        library->AddMember(generatorFunctionConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(generatorFunctionConstructor, PropertyIds::prototype, library->generatorFunctionPrototype, PropertyNone);
        library->AddMember(generatorFunctionConstructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("GeneratorFunction")), PropertyConfigurable);

        generatorFunctionConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }